

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_util.cpp
# Opt level: O3

string_view __thiscall libtorrent::aux::strip_string(aux *this,string_view in)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  long lVar4;
  byte *pbVar5;
  byte *pbVar6;
  long lVar7;
  bool bVar8;
  string_view sVar9;
  
  pbVar5 = (byte *)in._M_len;
  if (this == (aux *)0x0) {
    auVar2._8_8_ = 0;
    auVar2._0_8_ = pbVar5;
    return (string_view)(auVar2 << 0x40);
  }
  lVar4 = -(long)this;
  pbVar6 = pbVar5;
  while ((*pbVar6 - 9 < 5 || (*pbVar6 == 0x20))) {
    pbVar6 = pbVar6 + 1;
    lVar4 = lVar4 + 1;
    if (lVar4 == 0) {
      auVar1._8_8_ = 0;
      auVar1._0_8_ = pbVar5 + (long)this;
      return (string_view)(auVar1 << 0x40);
    }
  }
  lVar7 = 0;
  while (((pbVar5 + (long)this)[lVar7 + -1] - 9 < 5 || ((pbVar5 + (long)this)[lVar7 + -1] == 0x20)))
  {
    bVar8 = lVar4 + 1 == lVar7;
    lVar7 = lVar7 + -1;
    if (bVar8) {
      auVar3._8_8_ = 0;
      auVar3._0_8_ = pbVar6;
      return (string_view)(auVar3 << 0x40);
    }
  }
  sVar9._M_str = (char *)pbVar6;
  sVar9._M_len = lVar7 - lVar4;
  return sVar9;
}

Assistant:

string_view strip_string(string_view in)
	{
		while (!in.empty() && is_space(in.front()))
			in.remove_prefix(1);

		while (!in.empty() && is_space(in.back()))
			in.remove_suffix(1);
		return in;
	}